

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ipv4_tbl.c
# Opt level: O2

int zt_ipv4_tbl_add_node(zt_ipv4_tbl *tbl,zt_ipv4_node *node)

{
  uint uVar1;
  zt_mem_pool *pool;
  zt_ipv4_node **__s;
  zt_ipv4_addr *pzVar2;
  long lVar3;
  byte bVar4;
  int iVar5;
  
  iVar5 = -1;
  if (node != (zt_ipv4_node *)0x0 && tbl != (zt_ipv4_tbl *)0x0) {
    if (node->addr->bitlen == '\0') {
      tbl->any = node;
    }
    else {
      pool = zt_mem_pool_get("zt_ipv4_node_hash");
      if (pool == (zt_mem_pool *)0x0) {
        return -1;
      }
      pzVar2 = node->addr;
      bVar4 = pzVar2->bitlen - 1;
      __s = tbl->tbl[bVar4];
      if (__s == (zt_ipv4_node **)0x0) {
        __s = (zt_ipv4_node **)zt_mem_pool_alloc(pool);
        if (__s == (zt_ipv4_node **)0x0) {
          return -1;
        }
        memset(__s,0,(ulong)tbl->sz << 3);
        tbl->tbl[bVar4] = __s;
        pzVar2 = node->addr;
      }
      uVar1 = tbl->sz - 1 & pzVar2->addr;
      if (__s[uVar1] != (zt_ipv4_node *)0x0) {
        node->next = __s[uVar1];
        __s = tbl->tbl[bVar4];
      }
      __s[uVar1] = node;
      pzVar2 = node->addr;
      for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 1) {
        if (tbl->in[lVar3] == '\0') goto LAB_0012179e;
        if (tbl->in[lVar3] == pzVar2->bitlen) goto LAB_001217a7;
      }
      pzVar2 = node->addr;
      lVar3 = 0x20;
LAB_0012179e:
      tbl->in[lVar3] = pzVar2->bitlen;
    }
LAB_001217a7:
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int
zt_ipv4_tbl_add_node(zt_ipv4_tbl * tbl, zt_ipv4_node * node)
{
    zt_ipv4_node *node_slot;
    zt_mem_pool  *pool;
    uint32_t      key;
    uint8_t       blen;
    int           is_in;
    int           i;

    if (!tbl || !node) {
        return -1;
    }

    if (node->addr->bitlen == 0) {
        /*
         * this is a 0.0.0.0/0 network, set the any to this node
         */
        tbl->any = node;
        return 0;
    }

    if (!(pool = zt_mem_pool_get("zt_ipv4_node_hash"))) {
        return -1;
    }

    is_in = 0;
    blen = node->addr->bitlen - 1;

    if (tbl->tbl[blen] == NULL) {
        zt_ipv4_node **hash_entry;

        if (!(hash_entry = zt_mem_pool_alloc(pool))) {
            return -1;
        }

        memset(hash_entry, 0, sizeof(zt_ipv4_node *) * tbl->sz);

        tbl->tbl[blen] = hash_entry;
    }

    key = node->addr->addr & (tbl->sz - 1);
    node_slot = tbl->tbl[blen][key];

    if (node_slot != NULL) {
        node->next = node_slot;
    }

    tbl->tbl[blen][key] = node;

    /*
     * set our in array to this bitlen if it doesn't exist
     * we use this to iterate through the prefixes.
     *
     * For example if the bitlen is /32 and we add one node
     * tbl->in[0] would be 32.
     *
     * When we search for an address within our table the
     * only work we have to do is checking bitlengths found
     * within this in array
     */

    for (i = 0; i < 32; i++) {
        if (tbl->in[i] == 0) {
            break;
        }

        if (tbl->in[i] == node->addr->bitlen) {
            is_in = 1;
            break;
        }
    }

    /*
     * the bitlen doesn't exist, so add it to the last
     * open slot
     */
    if (is_in == 0) {
        tbl->in[i] = node->addr->bitlen;
    }

    return 0;
}